

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *s;
  size_t sVar1;
  int iVar2;
  LogMessage *other;
  ulong uVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  char *pcVar6;
  unsigned_long local_90;
  unsigned_long local_88;
  unsigned_long local_80;
  size_t new_size;
  size_t old_size;
  byte local_59;
  LogMessage local_58;
  int *local_20;
  int *size_local;
  void **data_local;
  StringOutputStream *this_local;
  
  local_59 = 0;
  local_20 = size;
  size_local = (int *)data;
  data_local = (void **)this;
  if (this->target_ == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x8e);
    local_59 = 1;
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&old_size + 3),other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  uVar3 = std::__cxx11::string::size();
  new_size = uVar3;
  uVar4 = std::__cxx11::string::capacity();
  if (uVar3 < uVar4) {
    local_80 = std::__cxx11::string::capacity();
  }
  else {
    local_80 = new_size << 1;
  }
  sVar1 = new_size;
  iVar2 = std::numeric_limits<int>::max();
  local_88 = sVar1 + (long)iVar2;
  puVar5 = std::min<unsigned_long>(&local_80,&local_88);
  local_80 = *puVar5;
  s = this->target_;
  local_90 = 0x10;
  puVar5 = std::max<unsigned_long>(&local_80,&local_90);
  STLStringResizeUninitialized(s,*puVar5);
  pcVar6 = mutable_string_data(this->target_);
  *(char **)size_local = pcVar6 + new_size;
  iVar2 = std::__cxx11::string::size();
  *local_20 = iVar2 - (int)new_size;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  size_t old_size = target_->size();

  // Grow the string.
  size_t new_size;
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    new_size = target_->capacity();
  } else {
    // Size has reached capacity, try to double it.
    new_size = old_size * 2;
  }
  // Avoid integer overflow in returned '*size'.
  new_size = std::min(new_size, old_size + std::numeric_limits<int>::max());
  // Increase the size, also make sure that it is at least kMinimumSize.
  STLStringResizeUninitialized(
      target_,
      std::max(new_size,
               kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}